

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singledocparser.cpp
# Opt level: O0

void __thiscall
YAML::SingleDocParser::HandleDocument(SingleDocParser *this,EventHandler *eventHandler)

{
  bool bVar1;
  Token *pTVar2;
  Scanner *in_RSI;
  bool bVar3;
  EventHandler *in_stack_000001c8;
  SingleDocParser *in_stack_000001d0;
  Scanner *this_00;
  
  this_00 = in_RSI;
  pTVar2 = Scanner::peek(in_RSI);
  (**(code **)((this_00->INPUT).m_input + 0x10))(this_00,&pTVar2->mark);
  pTVar2 = Scanner::peek(this_00);
  if (pTVar2->type == DOC_START) {
    Scanner::pop(this_00);
  }
  HandleNode(in_stack_000001d0,in_stack_000001c8);
  (**(code **)((in_RSI->INPUT).m_input + 0x18))();
  while( true ) {
    bVar1 = Scanner::empty(this_00);
    bVar3 = false;
    if (!bVar1) {
      pTVar2 = Scanner::peek(this_00);
      bVar3 = pTVar2->type == DOC_END;
    }
    if (!bVar3) break;
    Scanner::pop(this_00);
  }
  return;
}

Assistant:

void SingleDocParser::HandleDocument(EventHandler& eventHandler) {
  assert(!m_scanner.empty());  // guaranteed that there are tokens
  assert(!m_curAnchor);

  eventHandler.OnDocumentStart(m_scanner.peek().mark);

  // eat doc start
  if (m_scanner.peek().type == Token::DOC_START)
    m_scanner.pop();

  // recurse!
  HandleNode(eventHandler);

  eventHandler.OnDocumentEnd();

  // and finally eat any doc ends we see
  while (!m_scanner.empty() && m_scanner.peek().type == Token::DOC_END)
    m_scanner.pop();
}